

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::SSBOBindingRenderCase::deinit(SSBOBindingRenderCase *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer puVar2;
  pointer puVar3;
  long lVar4;
  long lVar5;
  
  LayoutBindingRenderCase::deinit(&this->super_LayoutBindingRenderCase);
  puVar2 = (this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  puVar3 = (this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)puVar3 - (long)puVar2) >> 2)) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      if (*(int *)((long)puVar2 + lVar4) != 0) {
        iVar1 = (*((this->super_LayoutBindingRenderCase).super_TestCase.m_context)->m_renderCtx->
                  _vptr_RenderContext[3])();
        (**(code **)(CONCAT44(extraout_var,iVar1) + 0x438))
                  (1,(long)(this->m_buffers).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar4);
        iVar1 = (*((this->super_LayoutBindingRenderCase).super_TestCase.m_context)->m_renderCtx->
                  _vptr_RenderContext[3])();
        (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0x40))(0x90d2,0);
        puVar2 = (this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        *(undefined4 *)((long)puVar2 + lVar4) = 0;
        puVar3 = (this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      }
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 4;
    } while (lVar5 < (int)((ulong)((long)puVar3 - (long)puVar2) >> 2));
  }
  return;
}

Assistant:

void SSBOBindingRenderCase::deinit (void)
{
	LayoutBindingRenderCase::deinit();

	// Clean up SSBO data
	for (int bufNdx = 0; bufNdx < (int)m_buffers.size(); ++bufNdx)
	{
		if (m_buffers[bufNdx])
		{
			m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_buffers[bufNdx]);
			m_context.getRenderContext().getFunctions().bindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
			m_buffers[bufNdx] = 0;
		}
	}
}